

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escape.c
# Opt level: O2

CURLcode Curl_urldecode(char *string,size_t length,char **ostring,size_t *olen,urlreject ctrl)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  byte *pbVar5;
  CURLcode CVar6;
  long lVar7;
  byte *pbVar8;
  byte bVar9;
  long lVar10;
  
  if (length == 0) {
    length = strlen(string);
  }
  pbVar5 = (byte *)(*Curl_cmalloc)(length + 1);
  if (pbVar5 == (byte *)0x0) {
    CVar6 = CURLE_OUT_OF_MEMORY;
  }
  else {
    *ostring = (char *)pbVar5;
    lVar3 = -1;
    lVar4 = 1;
    pbVar8 = pbVar5;
    for (; length != 0; length = length + lVar7) {
      bVar9 = *string;
      lVar7 = lVar3;
      lVar10 = lVar4;
      if (2 < length && bVar9 == 0x25) {
        bVar1 = ((byte *)string)[1];
        if (((byte)(bVar1 - 0x30) < 10) ||
           ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0))))
        {
          bVar2 = ((byte *)string)[2];
          if (((byte)(bVar2 - 0x30) < 10) ||
             ((bVar2 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))
             ) {
            bVar9 = Curl_debug::s_infotype[0][bVar1] << 4 | Curl_debug::s_infotype[0][bVar2];
            lVar7 = -3;
            lVar10 = 3;
          }
        }
      }
      if ((ctrl == REJECT_CTRL && bVar9 < 0x20) || (ctrl == REJECT_ZERO && bVar9 == 0)) {
        (*Curl_cfree)(*ostring);
        *ostring = (char *)0x0;
        return CURLE_URL_MALFORMAT;
      }
      string = (char *)((byte *)string + lVar10);
      *pbVar8 = bVar9;
      pbVar8 = pbVar8 + 1;
      pbVar5 = pbVar5 + 1;
    }
    *pbVar8 = 0;
    CVar6 = CURLE_OK;
    if (olen != (size_t *)0x0) {
      *olen = (long)pbVar5 - (long)*ostring;
      CVar6 = CURLE_OK;
    }
  }
  return CVar6;
}

Assistant:

CURLcode Curl_urldecode(const char *string, size_t length,
                        char **ostring, size_t *olen,
                        enum urlreject ctrl)
{
  size_t alloc;
  char *ns;

  DEBUGASSERT(string);
  DEBUGASSERT(ctrl >= REJECT_NADA); /* crash on TRUE/FALSE */

  alloc = (length?length:strlen(string));
  ns = malloc(alloc + 1);

  if(!ns)
    return CURLE_OUT_OF_MEMORY;

  /* store output string */
  *ostring = ns;

  while(alloc) {
    unsigned char in = *string;
    if(('%' == in) && (alloc > 2) &&
       ISXDIGIT(string[1]) && ISXDIGIT(string[2])) {
      /* this is two hexadecimal digits following a '%' */
      in = (unsigned char)(onehex2dec(string[1]) << 4) | onehex2dec(string[2]);

      string += 3;
      alloc -= 3;
    }
    else {
      string++;
      alloc--;
    }

    if(((ctrl == REJECT_CTRL) && (in < 0x20)) ||
       ((ctrl == REJECT_ZERO) && (in == 0))) {
      Curl_safefree(*ostring);
      return CURLE_URL_MALFORMAT;
    }

    *ns++ = in;
  }
  *ns = 0; /* terminate it */

  if(olen)
    /* store output size */
    *olen = ns - *ostring;

  return CURLE_OK;
}